

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

FAudio_OPERATIONSET_Operation *
QueueOperation(FAudioVoice *voice,FAudio_OPERATIONSET_Type type,uint32_t operationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  uint32_t in_EDX;
  FAudio_OPERATIONSET_Type in_ESI;
  FAudioVoice *in_RDI;
  FAudio_OPERATIONSET_Operation *newop;
  FAudio_OPERATIONSET_Operation *latest;
  FAudio_OPERATIONSET_Operation *local_18;
  
  pFVar1 = (FAudio_OPERATIONSET_Operation *)(*in_RDI->audio->pMalloc)(0x30);
  pFVar1->Type = in_ESI;
  pFVar1->Voice = in_RDI;
  pFVar1->OperationSet = in_EDX;
  pFVar1->next = (FAudio_OPERATIONSET_Operation *)0x0;
  if (in_RDI->audio->queuedOperations == (FAudio_OPERATIONSET_Operation *)0x0) {
    in_RDI->audio->queuedOperations = pFVar1;
  }
  else {
    for (local_18 = in_RDI->audio->queuedOperations;
        local_18->next != (FAudio_OPERATIONSET_Operation *)0x0; local_18 = local_18->next) {
    }
    local_18->next = pFVar1;
  }
  return pFVar1;
}

Assistant:

static inline FAudio_OPERATIONSET_Operation* QueueOperation(
	FAudioVoice *voice,
	FAudio_OPERATIONSET_Type type,
	uint32_t operationSet
) {
	FAudio_OPERATIONSET_Operation *latest;
	FAudio_OPERATIONSET_Operation *newop = voice->audio->pMalloc(
		sizeof(FAudio_OPERATIONSET_Operation)
	);

	newop->Type = type;
	newop->Voice = voice;
	newop->OperationSet = operationSet;
	newop->next = NULL;

	if (voice->audio->queuedOperations == NULL)
	{
		voice->audio->queuedOperations = newop;
	}
	else
	{
		latest = voice->audio->queuedOperations;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = newop;
	}

	return newop;
}